

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxAssign::Resolve(FxAssign *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PType *this_00;
  PStruct *this_01;
  PClass *pPVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxTypeCast *this_02;
  PClass *pPVar7;
  undefined4 extraout_var_01;
  char *message;
  PClass *size;
  bool writable;
  FxExpression *pFVar6;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Base == (FxExpression *)0x0) goto LAB_0050a818;
  iVar5 = (*this->Base->_vptr_FxExpression[2])();
  pFVar6 = (FxExpression *)CONCAT44(extraout_var,iVar5);
  this->Base = pFVar6;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_0050a818;
  (this->super_FxExpression).ValueType = pFVar6->ValueType;
  if (this->Right == (FxExpression *)0x0) goto LAB_0050a818;
  size = (PClass *)ctx;
  iVar5 = (*this->Right->_vptr_FxExpression[2])();
  pFVar6 = (FxExpression *)CONCAT44(extraout_var_00,iVar5);
  this->Right = pFVar6;
  if (pFVar6 == (FxExpression *)0x0) goto LAB_0050a818;
  pPVar1 = this->Base->ValueType;
  if (((this->IsModifyAssign == true) && (pPVar1 == (PType *)TypeBool)) &&
     (pFVar6->ValueType != pPVar1)) {
    message = "Invalid modify/assign operation with a boolean operand";
  }
  else {
    cVar3 = (**(code **)(*(long *)&pPVar1->super_PTypeBase + 0x40))();
    if ((cVar3 == '\0') ||
       (iVar5 = (*(this->Right->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
       (char)iVar5 == '\0')) {
      pPVar2 = PNativeStruct::RegistrationInfo.MyClass;
      pPVar1 = this->Base->ValueType;
      this_00 = this->Right->ValueType;
      if (pPVar1 == this_00) {
        bVar4 = DObject::IsKindOf((DObject *)pPVar1,PArray::RegistrationInfo.MyClass);
        if (bVar4) {
          message = "Cannot assign arrays";
        }
        else {
          this_01 = (PStruct *)this->Base->ValueType;
          if (((this_01 == TypeVector2) || (this_01 == TypeVector3)) ||
             (bVar4 = DObject::IsKindOf((DObject *)this_01,PStruct::RegistrationInfo.MyClass),
             !bVar4)) goto LAB_0050a7b6;
          message = "Struct assignment not implemented yet";
        }
        goto LAB_0050a80e;
      }
      pPVar7 = DObject::GetClass((DObject *)this_00);
      if (((pPVar7 != pPVar2) ||
          (size = PPointer::RegistrationInfo.MyClass,
          bVar4 = DObject::IsKindOf((DObject *)this->Base->ValueType,
                                    PPointer::RegistrationInfo.MyClass), !bVar4)) ||
         (pFVar6 = this->Right,
         (PType *)this->Base->ValueType[1].super_PTypeBase.super_DObject._vptr_DObject !=
         pFVar6->ValueType)) {
        this_02 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        FxTypeCast::FxTypeCast(this_02,this->Right,this->Base->ValueType,false,false);
        goto LAB_0050a79d;
      }
      (*pFVar6->_vptr_FxExpression[4])(pFVar6,ctx,&writable);
      this->Right->ValueType = this->Base->ValueType;
    }
    else {
      pPVar1 = (this->super_FxExpression).ValueType;
      if (this->Right->ValueType != pPVar1) {
        if (pPVar1 == (PType *)TypeBool) {
          this_02 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
          FxBoolCast::FxBoolCast((FxBoolCast *)this_02,this->Right,true);
        }
        else if (pPVar1->RegType == '\0') {
          this_02 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
          FxIntCast::FxIntCast((FxIntCast *)this_02,this->Right,ctx->FromDecorate,false);
        }
        else {
          this_02 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x30,(size_t)size);
          FxFloatCast::FxFloatCast((FxFloatCast *)this_02,this->Right);
        }
LAB_0050a79d:
        this->Right = &this_02->super_FxExpression;
        iVar5 = (*(this_02->super_FxExpression)._vptr_FxExpression[2])(this_02,ctx);
        this->Right = (FxExpression *)CONCAT44(extraout_var_01,iVar5);
        if ((FxExpression *)CONCAT44(extraout_var_01,iVar5) == (FxExpression *)0x0)
        goto LAB_0050a818;
      }
    }
LAB_0050a7b6:
    iVar5 = (*this->Base->_vptr_FxExpression[4])(this->Base,ctx,&this->AddressWritable);
    if (((char)iVar5 != '\0') && (this->AddressWritable != false)) {
      iVar5 = (*this->Base->_vptr_FxExpression[8])();
      this->IsBitWrite = iVar5;
      return &this->super_FxExpression;
    }
    message = "Expression must be a modifiable value";
  }
LAB_0050a80e:
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
LAB_0050a818:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxAssign::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Base, ctx);

	ValueType = Base->ValueType;

	SAFE_RESOLVE(Right, ctx);

	if (IsModifyAssign && Base->ValueType == TypeBool && Right->ValueType != TypeBool)
	{
		// If the modify operation resulted in a type promotion from bool to int, this must be blocked.
		// (this means, for bool, only &=, ^= and |= are allowed, although DECORATE is more lax.)
		ScriptPosition.Message(MSG_ERROR, "Invalid modify/assign operation with a boolean operand");
		delete this;
		return nullptr;
	}

	// keep the redundant handling for numeric types here to avoid problems with DECORATE.
	// for non-numerics FxTypeCast can be used without issues.
	if (Base->IsNumeric() && Right->IsNumeric())
	{
		if (Right->ValueType != ValueType)
		{
			if (ValueType == TypeBool)
			{
				Right = new FxBoolCast(Right);
			}
			else if (ValueType->GetRegType() == REGT_INT)
			{
				Right = new FxIntCast(Right, ctx.FromDecorate);
			}
			else
			{
				Right = new FxFloatCast(Right);
			}
			SAFE_RESOLVE(Right, ctx);
		}
	}
	else if (Base->ValueType == Right->ValueType)
	{
		if (Base->ValueType->IsKindOf(RUNTIME_CLASS(PArray)))
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot assign arrays");
			delete this;
			return nullptr;
		}
		if (!Base->IsVector() && Base->ValueType->IsKindOf(RUNTIME_CLASS(PStruct)))
		{
			ScriptPosition.Message(MSG_ERROR, "Struct assignment not implemented yet");
			delete this;
			return nullptr;
		}
		// Both types are the same so this is ok.
	}
	else if (Right->ValueType->IsA(RUNTIME_CLASS(PNativeStruct)) && Base->ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && static_cast<PPointer*>(Base->ValueType)->PointedType == Right->ValueType)
	{
		// allow conversion of native structs to pointers of the same type. This is necessary to assign elements from global arrays like players, sectors, etc. to local pointers.
		// For all other types this is not needed. Structs are not assignable and classes can only exist as references.
		bool writable;
		Right->RequestAddress(ctx, &writable);
		Right->ValueType = Base->ValueType;
	}
	else
	{
		// pass it to FxTypeCast for complete handling.
		Right = new FxTypeCast(Right, Base->ValueType, false);
		SAFE_RESOLVE(Right, ctx);
	}

	if (!Base->RequestAddress(ctx, &AddressWritable) || !AddressWritable)
	{
		ScriptPosition.Message(MSG_ERROR, "Expression must be a modifiable value");
		delete this;
		return nullptr;
	}

	// Special case: Assignment to a bitfield.
	IsBitWrite = Base->GetBitValue();
	return this;
}